

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts3FirstFilter(sqlite3_int64 iDelta,char *pList,int nList,char *pOut)

{
  char cVar1;
  long lVar2;
  int iVar3;
  char **ppPoslist;
  char *in_RCX;
  int in_EDX;
  int iVar4;
  char **in_RSI;
  sqlite_int64 in_RDI;
  long in_FS_OFFSET;
  char *pEnd;
  int bWritten;
  int nOut;
  sqlite3_int64 iCol;
  char *p;
  sqlite_int64 *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint uVar5;
  int iVar6;
  char **local_10;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar6 = 0;
  uVar5 = 0;
  ppPoslist = (char **)((long)in_RSI + (long)in_EDX);
  local_10 = in_RSI;
  if (*(char *)in_RSI != '\x01') {
    cVar1 = *(char *)in_RSI;
    if (cVar1 == '\x02') {
      iVar3 = sqlite3Fts3PutVarint(in_RCX,in_RDI);
      iVar3 = iVar3 + iVar6;
      iVar6 = iVar3 + 1;
      in_RCX[iVar3] = '\x02';
    }
    uVar5 = (uint)(cVar1 == '\x02');
    fts3ColumnlistCopy((char **)CONCAT44(iVar6,uVar5),ppPoslist);
  }
  while (local_10 < ppPoslist) {
    iVar3 = sqlite3Fts3GetVarint
                      ((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffa8);
    local_10 = (char **)((long)local_10 + (long)iVar3 + 1);
    if (*(char *)local_10 == '\x02') {
      if (uVar5 == 0) {
        iVar3 = sqlite3Fts3PutVarint(in_RCX + iVar6,in_RDI);
        iVar6 = iVar3 + iVar6;
        uVar5 = 1;
      }
      iVar4 = iVar6 + 1;
      in_RCX[iVar6] = '\x01';
      iVar3 = sqlite3Fts3PutVarint(in_RCX + iVar4,-0x5555555555555556);
      iVar6 = iVar3 + iVar4 + 1;
      in_RCX[iVar3 + iVar4] = '\x02';
    }
    fts3ColumnlistCopy((char **)CONCAT44(iVar6,uVar5),ppPoslist);
  }
  iVar3 = iVar6;
  if (uVar5 != 0) {
    iVar3 = iVar6 + 1;
    in_RCX[iVar6] = '\0';
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3FirstFilter(
  sqlite3_int64 iDelta,           /* Varint that may be written to pOut */
  char *pList,                    /* Position list (no 0x00 term) */
  int nList,                      /* Size of pList in bytes */
  char *pOut                      /* Write output here */
){
  int nOut = 0;
  int bWritten = 0;               /* True once iDelta has been written */
  char *p = pList;
  char *pEnd = &pList[nList];

  if( *p!=0x01 ){
    if( *p==0x02 ){
      nOut += sqlite3Fts3PutVarint(&pOut[nOut], iDelta);
      pOut[nOut++] = 0x02;
      bWritten = 1;
    }
    fts3ColumnlistCopy(0, &p);
  }

  while( p<pEnd ){
    sqlite3_int64 iCol;
    p++;
    p += sqlite3Fts3GetVarint(p, &iCol);
    if( *p==0x02 ){
      if( bWritten==0 ){
        nOut += sqlite3Fts3PutVarint(&pOut[nOut], iDelta);
        bWritten = 1;
      }
      pOut[nOut++] = 0x01;
      nOut += sqlite3Fts3PutVarint(&pOut[nOut], iCol);
      pOut[nOut++] = 0x02;
    }
    fts3ColumnlistCopy(0, &p);
  }
  if( bWritten ){
    pOut[nOut++] = 0x00;
  }

  return nOut;
}